

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test::
~TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test
          (TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithUnsignedIntegerParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithUnsignedIntegerParameter)
{
    const SimpleString paramName = "paramName";
    unsigned int value = 356;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("unsigned int", call->getInputParameterType(paramName).asCharString());
    LONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> unsigned int paramName: <356 (0x164)>", call->callToString().asCharString());
}